

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O0

set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
* __thiscall
spvtools::opt::LoopDependenceAnalysis::CollectLoops
          (set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
           *__return_storage_ptr__,LoopDependenceAnalysis *this,SENode *source,SENode *destination)

{
  iterator __first;
  iterator __last;
  undefined1 local_90 [8];
  set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  destination_loops;
  undefined1 local_58 [8];
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  destination_nodes;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  source_nodes;
  SENode *destination_local;
  SENode *source_local;
  LoopDependenceAnalysis *this_local;
  set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  *loops;
  
  if ((source == (SENode *)0x0) || (destination == (SENode *)0x0)) {
    memset(__return_storage_ptr__,0,0x30);
    std::
    set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
    ::set(__return_storage_ptr__);
  }
  else {
    SENode::CollectRecurrentNodes
              ((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                *)&destination_nodes.
                   super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,source);
    SENode::CollectRecurrentNodes
              ((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                *)local_58,destination);
    destination_loops._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
    CollectLoops(__return_storage_ptr__,this,
                 (vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                  *)&destination_nodes.
                     super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    CollectLoops((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                  *)local_90,this,
                 (vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                  *)local_58);
    __first = std::
              begin<std::set<spvtools::opt::Loop_const*,std::less<spvtools::opt::Loop_const*>,std::allocator<spvtools::opt::Loop_const*>>>
                        ((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                          *)local_90);
    __last = std::
             end<std::set<spvtools::opt::Loop_const*,std::less<spvtools::opt::Loop_const*>,std::allocator<spvtools::opt::Loop_const*>>>
                       ((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                         *)local_90);
    std::
    set<spvtools::opt::Loop_const*,std::less<spvtools::opt::Loop_const*>,std::allocator<spvtools::opt::Loop_const*>>
    ::insert<std::_Rb_tree_const_iterator<spvtools::opt::Loop_const*>>
              ((set<spvtools::opt::Loop_const*,std::less<spvtools::opt::Loop_const*>,std::allocator<spvtools::opt::Loop_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_spvtools::opt::Loop_*>)__first._M_node,
               (_Rb_tree_const_iterator<const_spvtools::opt::Loop_*>)__last._M_node);
    destination_loops._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
    std::
    set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
    ::~set((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
            *)local_90);
    if ((destination_loops._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
      std::
      set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
      ::~set(__return_storage_ptr__);
    }
    std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
    ::~vector((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
               *)local_58);
    std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
    ::~vector((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
               *)&destination_nodes.
                  super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<const Loop*> LoopDependenceAnalysis::CollectLoops(
    SENode* source, SENode* destination) {
  if (!source || !destination) {
    return std::set<const Loop*>{};
  }

  std::vector<SERecurrentNode*> source_nodes = source->CollectRecurrentNodes();
  std::vector<SERecurrentNode*> destination_nodes =
      destination->CollectRecurrentNodes();

  std::set<const Loop*> loops = CollectLoops(source_nodes);
  std::set<const Loop*> destination_loops = CollectLoops(destination_nodes);

  loops.insert(std::begin(destination_loops), std::end(destination_loops));

  return loops;
}